

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseConditionalSections(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlParserErrors code;
  uint uVar3;
  xmlChar *pxVar4;
  void *pvVar5;
  xmlParserInputPtr pxVar6;
  void *pvVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong local_38;
  
  uVar11 = 0;
  local_38 = 0;
  pvVar7 = (void *)0x0;
  do {
    if (1 < ctxt->disableSAX) {
LAB_00139d44:
      (*xmlFree)(pvVar7);
      return;
    }
    pxVar6 = ctxt->input;
    pxVar4 = pxVar6->cur;
    if (*pxVar4 == '<') {
      if ((pxVar4[1] == '!') && (pxVar4[2] == '[')) {
        iVar2 = pxVar6->id;
        pxVar6->cur = pxVar4 + 3;
        pxVar6->col = pxVar6->col + 3;
        if (pxVar4[3] == '\0') {
          xmlParserGrow(ctxt);
        }
        xmlSkipBlankCharsPE(ctxt);
        pxVar6 = ctxt->input;
        pxVar4 = pxVar6->cur;
        if (*pxVar4 == 'I') {
          if (pxVar4[1] == 'G') {
            if ((((pxVar4[2] == 'N') && (pxVar4[3] == 'O')) && (pxVar4[4] == 'R')) &&
               (pxVar4[5] == 'E')) {
              pxVar6->cur = pxVar4 + 6;
              pxVar6->col = pxVar6->col + 6;
              if (pxVar4[6] == '\0') {
                xmlParserGrow(ctxt);
              }
              xmlSkipBlankCharsPE(ctxt);
              if (*ctxt->input->cur != '[') goto LAB_00139d6d;
              if (ctxt->input->id != iVar2) {
                xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not in the same entity\n");
              }
              xmlNextChar(ctxt);
              lVar9 = 0;
              while (pxVar6 = ctxt->input, ctxt->disableSAX < 2) {
                pxVar4 = pxVar6->cur;
                xVar1 = *pxVar4;
                if (xVar1 == '<') {
                  if ((pxVar4[1] == '!') && (pxVar4[2] == '[')) {
                    pxVar6->cur = pxVar4 + 3;
                    pxVar6->col = pxVar6->col + 3;
                    if (pxVar4[3] == '\0') {
                      xmlParserGrow(ctxt);
                    }
                    lVar9 = lVar9 + 1;
                    if (lVar9 == 0) goto LAB_00139d71;
                  }
                  else {
LAB_00139c6e:
                    xmlNextChar(ctxt);
                  }
                }
                else {
                  if (xVar1 != ']') {
                    if (xVar1 != '\0') goto LAB_00139c6e;
                    xmlFatalErr(ctxt,XML_ERR_CONDSEC_NOT_FINISHED,(char *)0x0);
                    goto LAB_00139d44;
                  }
                  if ((pxVar4[1] != ']') || (pxVar4[2] != '>')) goto LAB_00139c6e;
                  pxVar6->cur = pxVar4 + 3;
                  pxVar6->col = pxVar6->col + 3;
                  if (pxVar4[3] == '\0') {
                    xmlParserGrow(ctxt);
                  }
                  if (lVar9 == 0) {
                    pxVar6 = ctxt->input;
                    break;
                  }
                  lVar9 = lVar9 + -1;
                }
              }
              if (pxVar6->id != iVar2) {
                xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not in the same entity\n");
              }
              goto LAB_00139b32;
            }
          }
          else if ((((pxVar4[1] == 'N') && (pxVar4[2] == 'C')) && (pxVar4[3] == 'L')) &&
                  (((pxVar4[4] == 'U' && (pxVar4[5] == 'D')) && (pxVar4[6] == 'E')))) {
            pxVar6->cur = pxVar4 + 7;
            pxVar6->col = pxVar6->col + 7;
            if (pxVar4[7] == '\0') {
              xmlParserGrow(ctxt);
            }
            xmlSkipBlankCharsPE(ctxt);
            if (*ctxt->input->cur != '[') {
LAB_00139d6d:
              code = XML_ERR_CONDSEC_INVALID;
              goto LAB_00139d31;
            }
            if (ctxt->input->id != iVar2) {
              xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                             "All markup of the conditional section is not in the same entity\n");
            }
            xmlNextChar(ctxt);
            pvVar5 = pvVar7;
            if (local_38 <= uVar11) {
              uVar10 = 4;
              uVar3 = (uint)local_38;
              if (0 < (int)uVar3) {
                if (999 < uVar3) {
                  xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,
                                 "Maximum conditional section nesting depth exceeded\n");
                  goto LAB_00139d44;
                }
                uVar8 = uVar3 + 1 >> 1;
                uVar10 = (ulong)(uVar8 + uVar3);
                if (1000 - uVar8 < uVar3) {
                  uVar10 = 1000;
                }
              }
              pvVar5 = (*xmlRealloc)(pvVar7,uVar10 * 4);
              local_38 = uVar10;
              if (pvVar5 == (void *)0x0) {
LAB_00139d71:
                xmlCtxtErrMemory(ctxt);
                goto LAB_00139d44;
              }
            }
            *(int *)((long)pvVar5 + uVar11 * 4) = iVar2;
            uVar11 = uVar11 + 1;
            pvVar7 = pvVar5;
            goto LAB_00139b32;
          }
        }
        code = XML_ERR_CONDSEC_INVALID_KEYWORD;
        goto LAB_00139d31;
      }
      if ((pxVar4[1] != '?') && (pxVar4[1] != '!')) goto LAB_00139d2b;
      xmlParseMarkupDecl(ctxt);
    }
    else {
      if (((uVar11 == 0) || (*pxVar4 != ']')) || ((pxVar4[1] != ']' || (pxVar4[2] != '>')))) {
LAB_00139d2b:
        code = XML_ERR_EXT_SUBSET_NOT_FINISHED;
LAB_00139d31:
        xmlFatalErr(ctxt,code,(char *)0x0);
        xmlHaltParser(ctxt);
        goto LAB_00139d44;
      }
      if (pxVar6->id != *(int *)((long)pvVar7 + uVar11 * 4 + -4)) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "All markup of the conditional section is not in the same entity\n");
        pxVar6 = ctxt->input;
        pxVar4 = pxVar6->cur;
      }
      pxVar6->cur = pxVar4 + 3;
      pxVar6->col = pxVar6->col + 3;
      uVar11 = uVar11 - 1;
      if (pxVar4[3] == '\0') {
        xmlParserGrow(ctxt);
      }
    }
LAB_00139b32:
    if (uVar11 == 0) goto LAB_00139d44;
    xmlSkipBlankCharsPE(ctxt);
    pxVar6 = ctxt->input;
    uVar3 = pxVar6->flags;
    if ((uVar3 & 0x40) == 0) {
      xmlParserShrink(ctxt);
      pxVar6 = ctxt->input;
      uVar3 = pxVar6->flags;
    }
    if (((uVar3 & 0x40) == 0) && ((long)pxVar6->end - (long)pxVar6->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
  } while( true );
}

Assistant:

static void
xmlParseConditionalSections(xmlParserCtxtPtr ctxt) {
    int *inputIds = NULL;
    size_t inputIdsSize = 0;
    size_t depth = 0;

    while (PARSER_STOPPED(ctxt) == 0) {
        if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
            int id = ctxt->input->id;

            SKIP(3);
            SKIP_BLANKS_PE;

            if (CMP7(CUR_PTR, 'I', 'N', 'C', 'L', 'U', 'D', 'E')) {
                SKIP(7);
                SKIP_BLANKS_PE;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                if (inputIdsSize <= depth) {
                    int *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(inputIdsSize, sizeof(tmp[0]),
                                              4, 1000);
                    if (newSize < 0) {
                        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                                       "Maximum conditional section nesting"
                                       " depth exceeded\n");
                        goto error;
                    }
                    tmp = xmlRealloc(inputIds, newSize * sizeof(tmp[0]));
                    if (tmp == NULL) {
                        xmlErrMemory(ctxt);
                        goto error;
                    }
                    inputIds = tmp;
                    inputIdsSize = newSize;
                }
                inputIds[depth] = id;
                depth++;
            } else if (CMP6(CUR_PTR, 'I', 'G', 'N', 'O', 'R', 'E')) {
                size_t ignoreDepth = 0;

                SKIP(6);
                SKIP_BLANKS_PE;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                while (PARSER_STOPPED(ctxt) == 0) {
                    if (RAW == 0) {
                        xmlFatalErr(ctxt, XML_ERR_CONDSEC_NOT_FINISHED, NULL);
                        goto error;
                    }
                    if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                        SKIP(3);
                        ignoreDepth++;
                        /* Check for integer overflow */
                        if (ignoreDepth == 0) {
                            xmlErrMemory(ctxt);
                            goto error;
                        }
                    } else if ((RAW == ']') && (NXT(1) == ']') &&
                               (NXT(2) == '>')) {
                        SKIP(3);
                        if (ignoreDepth == 0)
                            break;
                        ignoreDepth--;
                    } else {
                        NEXT;
                    }
                }

                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
            } else {
                xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID_KEYWORD, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        } else if ((depth > 0) &&
                   (RAW == ']') && (NXT(1) == ']') && (NXT(2) == '>')) {
            depth--;
            if (ctxt->input->id != inputIds[depth]) {
                xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not"
                               " in the same entity\n");
            }
            SKIP(3);
        } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
            xmlParseMarkupDecl(ctxt);
        } else {
            xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
            xmlHaltParser(ctxt);
            goto error;
        }

        if (depth == 0)
            break;

        SKIP_BLANKS_PE;
        SHRINK;
        GROW;
    }

error:
    xmlFree(inputIds);
}